

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRVersion.cpp
# Opt level: O0

Version * ZXing::QRCode::Version::Micro(int number)

{
  int iVar1;
  int in_EDI;
  array<ZXing::QRCode::ECBlocks,_4UL> *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  int versionNumber;
  Version *in_stack_fffffffffffffec0;
  Version *local_8;
  
  versionNumber = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  if (Micro(int)::allVersions == '\0') {
    iVar1 = __cxa_guard_acquire(&Micro(int)::allVersions);
    if (iVar1 != 0) {
      Version(in_stack_fffffffffffffec0,versionNumber,in_stack_fffffffffffffeb0);
      Version(in_stack_fffffffffffffec0,versionNumber,in_stack_fffffffffffffeb0);
      Version(in_stack_fffffffffffffec0,versionNumber,in_stack_fffffffffffffeb0);
      Version((Version *)0x10000000e,0,(array<ZXing::QRCode::ECBlocks,_4UL> *)0xe00000001);
      __cxa_atexit(__cxx_global_array_dtor_64,0,&__dso_handle);
      __cxa_guard_release(&Micro(int)::allVersions);
    }
  }
  if ((in_EDI < 1) || (4 < in_EDI)) {
    local_8 = (Version *)0x0;
  }
  else {
    local_8 = (Version *)
              &Model2::allVersions[(long)in_EDI + 0x27]._alignmentPatternCenters.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
  }
  return local_8;
}

Assistant:

const Version* Version::Micro(int number)
{
	/**
	 * See ISO 18004:2006 6.5.1 Table 9
	 */
	static const Version allVersions[] = {
		{1, {2, 1, 3, 0, 0}},
		{2, {5, 1, 5, 0, 0, 6, 1, 4, 0, 0}},
		{3, {6, 1, 11, 0, 0, 8, 1, 9, 0, 0}},
		{4, {8, 1, 16, 0, 0, 10, 1, 14, 0, 0, 14, 1, 10, 0, 0}}};

	if (number < 1 || number > 4)
		return nullptr;
	return allVersions + number - 1;
}